

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::anon_unknown_0::parse_template_param<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer psVar5;
  uint uVar6;
  ulong uVar7;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *t;
  pointer psVar8;
  char *pcVar9;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *temp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_78;
  value_type local_68;
  
  if ((1 < (long)last - (long)first) && (*first == 'T')) {
    if (first[1] == 0x5f) {
      pvVar3 = (db->template_param).
               super__Vector_base<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((db->template_param).
          super__Vector_base<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,_4096UL>_>
          ._M_impl.super__Vector_impl_data._M_start != pvVar3) {
        pvVar4 = pvVar3[-1].
                 super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pvVar4 == pvVar3[-1].
                      super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          paVar1 = &local_68.first.field_2;
          local_68.first._M_string_length = 2;
          local_68.first.field_2._M_allocated_capacity._0_3_ = 0x5f54;
          paVar2 = &local_68.second.field_2;
          local_68.second._M_string_length = 0;
          local_68.second.field_2._M_local_buf[0] = '\0';
          local_68.first._M_dataplus._M_p = (pointer)paVar1;
          local_68.second._M_dataplus._M_p = (pointer)paVar2;
          std::
          vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ::push_back(&db->names,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_68.second._M_dataplus._M_p != paVar2) {
            free(local_68.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_68.first._M_dataplus._M_p != paVar1) {
            free(local_68.first._M_dataplus._M_p);
          }
          first = first + 2;
          db->fix_forward_references = true;
        }
        else {
          psVar5 = (pvVar4->
                   super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (psVar8 = (pvVar4->
                        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                        )._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar5;
              psVar8 = psVar8 + 1) {
            std::
            vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ::push_back(&db->names,psVar8);
          }
          first = first + 2;
        }
      }
    }
    else {
      uVar6 = (int)first[1] - 0x30;
      pcVar9 = first + 2;
      if (pcVar9 != last && uVar6 < 10) {
        uVar7 = (ulong)uVar6;
        do {
          uVar6 = (int)*pcVar9 - 0x30;
          if (9 < uVar6) {
            if (*pcVar9 != '_') {
              return first;
            }
            pvVar3 = (db->template_param).
                     super__Vector_base<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,_4096UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((db->template_param).
                super__Vector_base<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>,_4096UL>_>
                ._M_impl.super__Vector_impl_data._M_start == pvVar3) {
              return first;
            }
            uVar7 = uVar7 + 1;
            pvVar4 = pvVar3[-1].
                     super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar7 < (ulong)((long)pvVar3[-1].
                                      super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 5
                               )) {
              psVar5 = pvVar4[uVar7].
                       super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (psVar8 = pvVar4[uVar7].
                            super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                            ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar5;
                  psVar8 = psVar8 + 1) {
                std::
                vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                ::push_back(&db->names,psVar8);
              }
              return pcVar9 + 1;
            }
            local_88 = &local_78;
            std::__cxx11::
            basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
            ::_M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                        *)&local_88,first,pcVar9 + 1);
            local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
            if (local_88 == &local_78) {
              local_68.first.field_2._8_8_ = local_78._8_8_;
            }
            else {
              local_68.first._M_dataplus._M_p = (pointer)local_88;
            }
            local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
            local_68.first._M_string_length = local_80;
            local_80 = 0;
            local_78._M_local_buf[0] = '\0';
            local_68.second._M_string_length = 0;
            local_68.second.field_2._M_local_buf[0] = '\0';
            local_88 = &local_78;
            std::
            vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ::push_back(&db->names,&local_68);
            string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
            ::~string_pair(&local_68);
            if (local_88 != &local_78) {
              free(local_88);
            }
            db->fix_forward_references = true;
            return pcVar9 + 1;
          }
          uVar7 = (ulong)uVar6 + uVar7 * 10;
          pcVar9 = pcVar9 + 1;
        } while (pcVar9 != last);
      }
    }
  }
  return first;
}

Assistant:

const char*
parse_template_param(const char* first, const char* last, C& db)
{
    if (last - first >= 2)
    {
        if (*first == 'T')
        {
            if (first[1] == '_')
            {
                if (db.template_param.empty())
                    return first;
                if (!db.template_param.back().empty())
                {
                    for (auto& t : db.template_param.back().front())
                        db.names.push_back(t);
                    first += 2;
                }
                else
                {
                    db.names.push_back("T_");
                    first += 2;
                    db.fix_forward_references = true;
                }
            }
            else if (isdigit(first[1]))
            {
                const char* t = first+1;
                size_t sub = static_cast<size_t>(*t - '0');
                for (++t; t != last && isdigit(*t); ++t)
                {
                    sub *= 10;
                    sub += static_cast<size_t>(*t - '0');
                }
                if (t == last || *t != '_' || db.template_param.empty())
                    return first;
                ++sub;
                if (sub < db.template_param.back().size())
                {
                    for (auto& temp : db.template_param.back()[sub])
                        db.names.push_back(temp);
                    first = t+1;
                }
                else
                {
                    db.names.push_back(typename C::String(first, t+1));
                    first = t+1;
                    db.fix_forward_references = true;
                }
            }
        }
    }
    return first;
}